

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_simplex_node(REF_GRID ref_grid)

{
  REF_NODE ref_node_00;
  byte bVar1;
  uint uVar2;
  int local_38;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL problem;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  _problem = ref_grid->cell[8];
  if ((ref_grid->twod != 0) || (ref_grid->surf != 0)) {
    _problem = ref_grid->cell[3];
  }
  bVar1 = 0;
  ref_private_macro_code_rss = 0;
  do {
    if (ref_node_00->max <= ref_private_macro_code_rss) {
      return (uint)bVar1;
    }
    if (((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < ref_node_00->max)) &&
       (-1 < ref_node_00->global[ref_private_macro_code_rss])) {
      if ((ref_private_macro_code_rss < 0) ||
         (_problem->ref_adj->nnode <= ref_private_macro_code_rss)) {
        local_38 = -1;
      }
      else {
        local_38 = _problem->ref_adj->first[ref_private_macro_code_rss];
      }
      if (local_38 == -1) {
        bVar1 = 1;
        uVar2 = ref_node_location(ref_node_00,ref_private_macro_code_rss);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x2e,"ref_validation_simplex_node",(ulong)uVar2,"location");
          return uVar2;
        }
      }
    }
    ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_simplex_node(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_BOOL problem;

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  problem = REF_FALSE;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_cell_node_empty(ref_cell, node)) {
      problem = REF_TRUE;
      RSS(ref_node_location(ref_node, node), "location");
    }
  }

  return (problem ? REF_FAILURE : REF_SUCCESS);
}